

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O2

void __thiscall CPT::CPT(CPT *this,size_t X,size_t Y)

{
  size_type sVar1;
  pointer pdVar2;
  long lVar3;
  size_t x;
  size_t sVar4;
  size_t sVar5;
  
  (this->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface = (_func_int **)&PTR__CPT_0061e2a8;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(&this->_m_probTable,X,Y);
  lVar3 = 0;
  for (sVar4 = 0; sVar4 != X; sVar4 = sVar4 + 1) {
    sVar1 = (this->_m_probTable).size2_;
    pdVar2 = (this->_m_probTable).data_.data_;
    for (sVar5 = 0; Y != sVar5; sVar5 = sVar5 + 1) {
      *(undefined8 *)((long)pdVar2 + sVar5 * 8 + sVar1 * lVar3) = 0;
    }
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

CPT::CPT(size_t X, size_t Y)
    :
    _m_probTable(X,Y)
{   
   for(size_t x=0; x < X; x++) 
       for(size_t y=0; y < Y; y++) 
           _m_probTable(x,y)=0;
}